

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::HostFunc>::RefPtr
          (RefPtr<wabt::interp::HostFunc> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  Object *pOVar2;
  HostFunc *pHVar3;
  iterator __position;
  Index IVar4;
  vector<wabt::interp::Object*,std::allocator<wabt::interp::Object*>> *this_00;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar2 & 1) == 0) {
    OVar1 = pOVar2->kind_;
    if (OVar1 != HostFunc) {
      if (ref.index == 0) {
        OVar1 = First;
      }
      this_00 = (vector<wabt::interp::Object*,std::allocator<wabt::interp::Object*>> *)(ulong)OVar1;
      interp::RefPtr((interp *)this_00);
      __position._M_current = *(Object ***)(this_00 + 8);
      if (__position._M_current == *(Object ***)(this_00 + 0x10)) {
        std::vector<wabt::interp::Object*,std::allocator<wabt::interp::Object*>>::
        _M_realloc_insert<wabt::interp::Object*>(this_00,__position,(Object **)store);
      }
      else {
        *__position._M_current = *(Object **)&store->features_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      return;
    }
    IVar4 = Store::NewRoot(store,ref);
    this->root_index_ = IVar4;
    pHVar3 = (HostFunc *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pHVar3 & 1) == 0) {
      this->obj_ = pHVar3;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}